

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::visibleButtons
          (QList<QAbstractButton_*> *__return_storage_ptr__,QDialogButtonBoxPrivate *this)

{
  ulong uVar1;
  int i;
  long lVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAbstractButton **)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = 0;
  do {
    if (this->buttonLists[lVar2].d.size != 0) {
      uVar1 = 0;
      do {
        local_40 = this->buttonLists[lVar2].d.ptr[uVar1];
        QtPrivate::QPodArrayOps<QAbstractButton*>::emplace<QAbstractButton*&>
                  ((QPodArrayOps<QAbstractButton*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_40);
        QList<QAbstractButton_*>::end(__return_storage_ptr__);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)this->buttonLists[lVar2].d.size);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::visibleButtons() const
{
    QList<QAbstractButton *> finalList;
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i) {
        const QList<QAbstractButton *> &list = buttonLists[i];
        for (int j = 0; j < list.size(); ++j)
            finalList.append(list.at(j));
    }
    return finalList;
}